

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O0

Vec3f TRM::barycentric<2ul>
                (vec<2,_float,_(glm::qualifier)0> A,vec<2,_float,_(glm::qualifier)0> B,
                vec<2,_float,_(glm::qualifier)0> C,vec<2,_float,_(glm::qualifier)0> P)

{
  float fVar1;
  float fVar2;
  Vec3f VVar3;
  float *pfVar4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *this;
  float extraout_XMM0_Da;
  vec<3,_float,_(glm::qualifier)0> vVar5;
  vec<3,_float,_(glm::qualifier)0> local_78;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_68;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_64;
  Vec3f u;
  int i;
  Vec3f s [2];
  vec<2,_float,_(glm::qualifier)0> local_34;
  vec<2,_float,_(glm::qualifier)0> P_local;
  vec<2,_float,_(glm::qualifier)0> C_local;
  vec<2,_float,_(glm::qualifier)0> B_local;
  vec<2,_float,_(glm::qualifier)0> A_local;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c;
  
  local_34 = P;
  P_local = C;
  C_local = B;
  B_local = A;
  for (u.field_1.y = 0.0; (int)u.field_1 < 2; u.field_1.y = u.field_1.y + 1) {
    pfVar4 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&P_local,(length_type)u.field_1);
    fVar1 = *pfVar4;
    pfVar4 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&B_local,(length_type)u.field_1);
    fVar2 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&(&u)[(int)u.field_1].field_2,0);
    *pfVar4 = fVar1 - fVar2;
    pfVar4 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&C_local,(length_type)u.field_1);
    fVar1 = *pfVar4;
    pfVar4 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&B_local,(length_type)u.field_1);
    fVar2 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&(&u)[(int)u.field_1].field_2,1);
    *pfVar4 = fVar1 - fVar2;
    pfVar4 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&B_local,(length_type)u.field_1);
    fVar1 = *pfVar4;
    pfVar4 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&local_34,(length_type)u.field_1);
    fVar2 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&(&u)[(int)u.field_1].field_2,2);
    *pfVar4 = fVar1 - fVar2;
  }
  vVar5 = glm::cross<float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)&u.field_2,
                     (vec<3,_float,_(glm::qualifier)0> *)&s[0].field_1);
  local_78._0_8_ = vVar5._0_8_;
  local_68 = local_78.field_0;
  aStack_64 = local_78.field_1;
  local_78.field_2 = vVar5.field_2;
  u.field_0.x = local_78.field_2.z;
  this = &local_68;
  glm::vec<3,_float,_(glm::qualifier)0>::operator[]((vec<3,_float,_(glm::qualifier)0> *)this,2);
  std::abs((int)this);
  if (extraout_XMM0_Da <= 0.01) {
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
              ((vec<3,float,(glm::qualifier)0> *)&A_local,-1,1,1);
  }
  else {
    glm::vec<3,_float,_(glm::qualifier)0>::vec
              ((vec<3,_float,_(glm::qualifier)0> *)&A_local,
               1.0 - (local_68.x + aStack_64.y) / u.field_0.x,aStack_64.y / u.field_0.x,
               local_68.x / u.field_0.x);
  }
  VVar3.field_2 = local_c;
  VVar3.field_0.x = A_local.field_0.x;
  VVar3.field_1.y = A_local.field_1.y;
  return VVar3;
}

Assistant:

Vec3f barycentric(glm::vec<DimRows, float, glm::defaultp> A,
                  glm::vec<DimRows, float, glm::defaultp> B,
                  glm::vec<DimRows, float, glm::defaultp> C,
                  glm::vec<DimRows, float, glm::defaultp> P) {
  if (DimRows < 2) {
    return Vec3f(1., 1., 1.);
  } else {
    Vec3f s[2];
    for (int i = 0; i < 2; i++) {
      s[i][0] = C[i] - A[i];
      s[i][1] = B[i] - A[i];
      s[i][2] = A[i] - P[i];
    }
    Vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) > 1e-2)  // dont forget that u[2] is integer. If it is
                                // zero then triangle ABC is degenerate
      return Vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return Vec3f(-1, 1, 1);  // in this case generate negative coordinates, it
                             // will be thrown away by the rasterizator
  }
}